

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smd.c
# Opt level: O3

int lws_smd_msg_distribute(lws_context *ctx)

{
  lws_mutex_t *__mutex;
  lws_mutex_t *__mutex_00;
  uint16_t *puVar1;
  lws_dll2 *plVar2;
  lws_smd_msg_t *msg;
  bool bVar3;
  lws_log_cx *cx;
  lws_dll2 *plVar4;
  lws_dll2 *plVar5;
  bool bVar6;
  
  if ((ctx->smd).owner_messages.count != 0) {
    (ctx->smd).delivering = '\x01';
    __mutex = &(ctx->smd).lock_peers;
    __mutex_00 = &(ctx->smd).lock_messages;
    do {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      plVar5 = (ctx->smd).owner_peers.head;
      if (plVar5 == (lws_dll2 *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        break;
      }
      bVar3 = false;
      do {
        plVar2 = plVar5->next;
        msg = (lws_smd_msg_t *)plVar5[2].prev;
        if (msg == (lws_smd_msg_t *)0x0) {
          bVar6 = false;
        }
        else {
          cx = lwsl_context_get_cx(ctx);
          _lws_log_cx(cx,lws_log_prepend_context,ctx,8,"_lws_smd_msg_deliver_peer",
                      "deliver cl 0x%x, len %d, refc %d, to peer %p",(ulong)msg->_class,
                      (ulong)msg->length,(ulong)msg->refcount,plVar5);
          (*(code *)plVar5[1].prev)(plVar5[1].owner,msg->_class,msg->timestamp,msg + 1,msg->length);
          if (msg->refcount == 0) {
            __assert_fail("msg->refcount",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/system/smd/smd.c"
                          ,0x21a,
                          "int _lws_smd_msg_deliver_peer(struct lws_context *, lws_smd_peer_t *)");
          }
          plVar4 = plVar5[2].prev;
          do {
            plVar4 = plVar4->next;
            if (plVar4 == (lws_dll2 *)0x0) {
              plVar4 = (lws_dll2 *)0x0;
              break;
            }
          } while ((plVar4[1].prev == plVar5) ||
                  ((*(uint *)&plVar5[2].next & *(uint *)&plVar4[1].owner) == 0));
          plVar5[2].prev = plVar4;
          pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
          puVar1 = &msg->refcount;
          *puVar1 = *puVar1 - 1;
          if (*puVar1 == 0) {
            _lws_smd_msg_destroy(ctx,&ctx->smd,msg);
          }
          pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
          bVar6 = plVar5[2].prev != (lws_dll2 *)0x0;
        }
        bVar3 = (bool)(bVar3 | bVar6);
        plVar5 = plVar2;
      } while (plVar2 != (lws_dll2 *)0x0);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    } while (bVar3);
    (ctx->smd).delivering = '\0';
  }
  return 0;
}

Assistant:

int
lws_smd_msg_distribute(struct lws_context *ctx)
{
	char more;

	/* commonly, no messages and nothing to do... */

	if (!ctx->smd.owner_messages.count)
		return 0;

	ctx->smd.delivering = 1;

	do {
		more = 0;
		lws_mutex_lock(ctx->smd.lock_peers); /* +++++++++++++++ peers */

		lws_start_foreach_dll_safe(struct lws_dll2 *, p, p1,
					   ctx->smd.owner_peers.head) {
			lws_smd_peer_t *pr = lws_container_of(p, lws_smd_peer_t, list);

			more = (char)(more | !!_lws_smd_msg_deliver_peer(ctx, pr));

		} lws_end_foreach_dll_safe(p, p1);

		lws_mutex_unlock(ctx->smd.lock_peers); /* ------------- peers */
	} while (more);

	ctx->smd.delivering = 0;

	return 0;
}